

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O3

ER __thiscall
slang::ast::ForeverLoopStatement::evalImpl(ForeverLoopStatement *this,EvalContext *context)

{
  ER EVar1;
  
  do {
    do {
      EVar1 = Statement::eval(this->body,context);
    } while (EVar1 == Success);
  } while (EVar1 == Continue);
  if (EVar1 == Break) {
    EVar1 = Success;
  }
  return EVar1;
}

Assistant:

ER ForeverLoopStatement::evalImpl(EvalContext& context) const {
    while (true) {
        ER result = body.eval(context);
        if (result != ER::Success) {
            if (result == ER::Break)
                break;
            else if (result != ER::Continue)
                return result;
        }
    }

    return ER::Success;
}